

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool processSources(cmGeneratorTarget *tgt,
                   vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                   *entries,vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *srcs,
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *uniqueSrcs,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
                   bool debugSources)

{
  TargetPropertyEntry *pTVar1;
  byte bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  byte bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  cmMakefile *this;
  reference ppTVar7;
  cmLocalGenerator *pcVar8;
  undefined4 extraout_var;
  reference sourceName;
  cmSourceFile *this_00;
  ostream *poVar9;
  ulong uVar10;
  cmake *pcVar11;
  string *psVar12;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar13;
  cmListFileBacktrace local_438;
  allocator<char> local_421;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  cmListFileBacktrace local_360;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_350;
  undefined1 local_348;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_340;
  undefined1 local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_330;
  string *src_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  string usedSources;
  undefined1 local_2d0 [8];
  ostringstream err;
  undefined1 local_150 [24];
  cmake *cm;
  string fullPath;
  string e;
  cmSourceFile *sf;
  string *src;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_c0 [32];
  undefined1 local_a0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entrySources;
  string *targetName;
  cmLinkImplItem *item;
  TargetPropertyEntry *entry;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  *__range1;
  bool contextDependent;
  cmMakefile *mf;
  bool debugSources_local;
  string *config_local;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *uniqueSrcs_local;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *srcs_local;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  *entries_local;
  cmGeneratorTarget *tgt_local;
  
  this = cmTarget::GetMakefile(tgt->Target);
  bVar2 = 0;
  __end1 = std::
           vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
           ::begin(entries);
  entry = (TargetPropertyEntry *)
          std::
          vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
          ::end(entries);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmGeneratorTarget::TargetPropertyEntry_*const_*,_std::vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>_>
                                     *)&entry), bVar3 = bVar2, bVar4) {
    ppTVar7 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget::TargetPropertyEntry_*const_*,_std::vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>_>
              ::operator*(&__end1);
    pTVar1 = *ppTVar7;
    entrySources.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         cmLinkItem::AsStr_abi_cxx11_(&pTVar1->LinkImplItem->super_cmLinkItem);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a0);
    pcVar8 = cmGeneratorTarget::GetLocalGenerator(tgt);
    std::__cxx11::string::string(local_c0);
    iVar5 = (*pTVar1->_vptr_TargetPropertyEntry[2])
                      (pTVar1,pcVar8,config,0,tgt,tgt,dagChecker,local_c0);
    cmSystemTools::ExpandListArgument
              ((string *)CONCAT44(extraout_var,iVar5),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a0,false);
    std::__cxx11::string::~string(local_c0);
    uVar6 = (*pTVar1->_vptr_TargetPropertyEntry[6])();
    if ((uVar6 & 1) != 0) {
      bVar2 = 1;
    }
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_a0);
    src = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a0);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&src), bVar4) {
      sourceName = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2);
      this_00 = cmMakefile::GetOrCreateSource(this,sourceName,false,Ambiguous);
      std::__cxx11::string::string((string *)(fullPath.field_2._M_local_buf + 8));
      psVar12 = cmSourceFile::GetFullPath(this_00,(string *)(fullPath.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)&cm,(string *)psVar12);
      uVar10 = std::__cxx11::string::empty();
      if ((uVar10 & 1) == 0) {
        uVar10 = std::__cxx11::string::empty();
        if (((uVar10 & 1) != 0) || (bVar4 = cmsys::SystemTools::FileIsFullPath(sourceName), bVar4))
        {
          std::__cxx11::string::operator=((string *)sourceName,(string *)&cm);
          bVar4 = false;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d0);
          uVar10 = std::__cxx11::string::empty();
          if ((uVar10 & 1) == 0) {
            poVar9 = std::operator<<((ostream *)local_2d0,"Target \"");
            poVar9 = std::operator<<(poVar9,(string *)
                                            entrySources.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
            poVar9 = std::operator<<(poVar9,
                                     "\" contains relative path in its INTERFACE_SOURCES:\n  \"");
            poVar9 = std::operator<<(poVar9,(string *)sourceName);
            std::operator<<(poVar9,"\"");
          }
          else {
            poVar9 = std::operator<<((ostream *)local_2d0,
                                     "Found relative path while evaluating sources of \"");
            psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
            poVar9 = std::operator<<(poVar9,(string *)psVar12);
            poVar9 = std::operator<<(poVar9,"\":\n  \"");
            poVar9 = std::operator<<(poVar9,(string *)sourceName);
            std::operator<<(poVar9,"\"\n");
          }
          pcVar8 = cmGeneratorTarget::GetLocalGenerator(tgt);
          std::__cxx11::ostringstream::str();
          cmLocalGenerator::IssueMessage
                    (pcVar8,FATAL_ERROR,(string *)((long)&usedSources.field_2 + 8));
          std::__cxx11::string::~string((string *)(usedSources.field_2._M_local_buf + 8));
          bVar4 = true;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d0);
          tgt_local._7_1_ = bVar2;
        }
      }
      else {
        uVar10 = std::__cxx11::string::empty();
        if ((uVar10 & 1) == 0) {
          pcVar8 = cmGeneratorTarget::GetLocalGenerator(tgt);
          pcVar11 = cmLocalGenerator::GetCMakeInstance(pcVar8);
          local_150._16_8_ = pcVar11;
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_150);
          cmake::IssueMessage(pcVar11,FATAL_ERROR,(string *)((long)&fullPath.field_2 + 8),
                              (cmListFileBacktrace *)local_150);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_150);
        }
        bVar4 = true;
        tgt_local._7_1_ = bVar2;
      }
      std::__cxx11::string::~string((string *)&cm);
      std::__cxx11::string::~string((string *)(fullPath.field_2._M_local_buf + 8));
      if (bVar4) goto LAB_0047a6c6;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::__cxx11::string::string((string *)&__range2_1);
    __end2_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_a0);
    src_1 = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a0);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&src_1), bVar4) {
      local_330 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2_1);
      pVar13 = std::
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert(uniqueSrcs,local_330);
      __args = local_330;
      local_350._M_cur =
           (__node_type *)
           pVar13.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_348 = pVar13.second;
      local_340._M_cur = local_350._M_cur;
      local_338 = local_348;
      if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        (*pTVar1->_vptr_TargetPropertyEntry[4])(&local_360);
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string_const&,cmListFileBacktrace>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)srcs
                   ,__args,&local_360);
        cmListFileBacktrace::~cmListFileBacktrace(&local_360);
        if (debugSources) {
          std::operator+(&local_3a0," * ",local_330);
          std::operator+(&local_380,&local_3a0,"\n");
          std::__cxx11::string::operator+=((string *)&__range2_1,(string *)&local_380);
          std::__cxx11::string::~string((string *)&local_380);
          std::__cxx11::string::~string((string *)&local_3a0);
        }
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_1);
    }
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      pcVar8 = cmGeneratorTarget::GetLocalGenerator(tgt);
      pcVar11 = cmLocalGenerator::GetCMakeInstance(pcVar8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_420,"Used sources for target ",&local_421);
      psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
      std::operator+(&local_400,&local_420,psVar12);
      std::operator+(&local_3e0,&local_400,":\n");
      std::operator+(&local_3c0,&local_3e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &__range2_1);
      (*pTVar1->_vptr_TargetPropertyEntry[4])(&local_438);
      cmake::IssueMessage(pcVar11,LOG,&local_3c0,&local_438);
      cmListFileBacktrace::~cmListFileBacktrace(&local_438);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::__cxx11::string::~string((string *)&local_400);
      std::__cxx11::string::~string((string *)&local_420);
      std::allocator<char>::~allocator(&local_421);
    }
    std::__cxx11::string::~string((string *)&__range2_1);
    bVar4 = false;
LAB_0047a6c6:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a0);
    bVar3 = tgt_local._7_1_;
    if (bVar4) break;
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget::TargetPropertyEntry_*const_*,_std::vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>_>
    ::operator++(&__end1);
  }
  tgt_local._7_1_ = bVar3;
  return (bool)(tgt_local._7_1_ & 1);
}

Assistant:

static bool processSources(
  cmGeneratorTarget const* tgt,
  const std::vector<cmGeneratorTarget::TargetPropertyEntry*>& entries,
  std::vector<BT<std::string>>& srcs,
  std::unordered_set<std::string>& uniqueSrcs,
  cmGeneratorExpressionDAGChecker* dagChecker, std::string const& config,
  bool debugSources)
{
  cmMakefile* mf = tgt->Target->GetMakefile();

  bool contextDependent = false;

  for (cmGeneratorTarget::TargetPropertyEntry* entry : entries) {
    cmLinkImplItem const& item = entry->LinkImplItem;
    std::string const& targetName = item.AsStr();
    std::vector<std::string> entrySources;
    cmSystemTools::ExpandListArgument(entry->Evaluate(tgt->GetLocalGenerator(),
                                                      config, false, tgt, tgt,
                                                      dagChecker),
                                      entrySources);

    if (entry->GetHadContextSensitiveCondition()) {
      contextDependent = true;
    }

    for (std::string& src : entrySources) {
      cmSourceFile* sf = mf->GetOrCreateSource(src);
      std::string e;
      std::string fullPath = sf->GetFullPath(&e);
      if (fullPath.empty()) {
        if (!e.empty()) {
          cmake* cm = tgt->GetLocalGenerator()->GetCMakeInstance();
          cm->IssueMessage(MessageType::FATAL_ERROR, e, tgt->GetBacktrace());
        }
        return contextDependent;
      }

      if (!targetName.empty() && !cmSystemTools::FileIsFullPath(src)) {
        std::ostringstream err;
        if (!targetName.empty()) {
          err << "Target \"" << targetName
              << "\" contains relative path in its INTERFACE_SOURCES:\n  \""
              << src << "\"";
        } else {
          err << "Found relative path while evaluating sources of \""
              << tgt->GetName() << "\":\n  \"" << src << "\"\n";
        }
        tgt->GetLocalGenerator()->IssueMessage(MessageType::FATAL_ERROR,
                                               err.str());
        return contextDependent;
      }
      src = fullPath;
    }
    std::string usedSources;
    for (std::string const& src : entrySources) {
      if (uniqueSrcs.insert(src).second) {
        srcs.emplace_back(src, entry->GetBacktrace());
        if (debugSources) {
          usedSources += " * " + src + "\n";
        }
      }
    }
    if (!usedSources.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::LOG,
        std::string("Used sources for target ") + tgt->GetName() + ":\n" +
          usedSources,
        entry->GetBacktrace());
    }
  }
  return contextDependent;
}